

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

PulseStyleSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::PulseStyleSymbol,slang::SourceLocation,slang::ast::PulseStyleKind&>
          (BumpAllocator *this,SourceLocation *args,PulseStyleKind *args_1)

{
  PulseStyleSymbol *pPVar1;
  size_t in_RDX;
  size_t in_RSI;
  PulseStyleSymbol *in_RDI;
  SourceLocation unaff_retaddr;
  
  pPVar1 = (PulseStyleSymbol *)allocate((BumpAllocator *)in_RDI,in_RSI,in_RDX);
  ast::PulseStyleSymbol::PulseStyleSymbol(in_RDI,unaff_retaddr,(PulseStyleKind)(in_RSI >> 0x20));
  return pPVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }